

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gru.cc
# Opt level: O2

Expression __thiscall dynet::GRUBuilder::add_input_impl(GRUBuilder *this,int prev,Expression *x)

{
  float fVar1;
  pointer pEVar2;
  pointer pEVar3;
  pointer pvVar4;
  undefined8 *puVar5;
  long lVar6;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *pvVar7;
  ulong uVar8;
  long lVar9;
  char cVar10;
  long lVar11;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  Expression EVar12;
  Expression ft;
  Expression crt;
  Expression h_tprev;
  Expression nwt;
  Expression local_148;
  undefined1 local_138 [16];
  Expression local_128;
  Expression *local_110;
  Expression local_108;
  Expression local_f8;
  pointer local_e8;
  Expression local_e0;
  int local_cc;
  Expression local_c8;
  long local_b0;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *local_a8;
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  *local_a0;
  GRUBuilder *local_98;
  ulong local_90;
  undefined1 local_88 [16];
  pointer local_78;
  pointer puStack_70;
  ComputationGraph *local_68;
  pointer puStack_60;
  ExecutionEngine *local_58;
  undefined8 uStack_50;
  Expression local_48;
  
  pEVar2 = (this->h0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pEVar3 = (this->h0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_110 = x;
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
            ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)local_88,
             (ulong)this->layers,(allocator_type *)local_138);
  local_a0 = &this->h;
  std::
  vector<std::vector<dynet::Expression,std::allocator<dynet::Expression>>,std::allocator<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>>
  ::emplace_back<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>
            ((vector<std::vector<dynet::Expression,std::allocator<dynet::Expression>>,std::allocator<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>>
              *)&this->h,(vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)local_88);
  local_a8 = &this->h0;
  std::_Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>::~_Vector_base
            ((_Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_> *)local_88);
  local_e8 = (this->h).
             super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_138 = *(undefined1 (*) [16])local_110;
  cVar10 = prev < 0 && pEVar3 == pEVar2;
  lVar9 = 0;
  local_b0 = (ulong)(uint)prev * 0x18;
  lVar11 = 0;
  local_110 = (Expression *)CONCAT71(local_110._1_7_,cVar10);
  uVar8 = 0;
  local_cc = prev;
  local_98 = this;
  while (uVar8 < local_98->layers) {
    pvVar4 = (local_98->param_vars).
             super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_c8.pg = (ComputationGraph *)0x0;
    local_c8.i = 0;
    local_c8.graph_id = 0;
    if (cVar10 == '\0') {
      pvVar7 = (vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
               ((long)&(((local_a0->
                         super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
                       _M_impl + local_b0);
      if (local_cc < 0) {
        pvVar7 = local_a8;
      }
      puVar5 = (undefined8 *)
               ((long)&((pvVar7->
                        super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
                        _M_impl.super__Vector_impl_data._M_start)->pg + lVar9);
      local_c8.pg = (ComputationGraph *)*puVar5;
      local_c8._8_8_ = puVar5[1];
    }
    fVar1 = (local_98->super_RNNBuilder).dropout_rate;
    local_90 = uVar8;
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      local_138 = (undefined1  [16])dropout((Expression *)local_138,fVar1);
    }
    local_128 = (Expression)ZEXT816(0);
    if (cVar10 == '\0') {
      local_88 = *(undefined1 (*) [16])
                  (*(long *)((long)&(pvVar4->
                                    super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                    )._M_impl.super__Vector_impl_data + lVar11) + 0x20);
      puVar5 = *(undefined8 **)
                ((long)&(pvVar4->
                        super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
                        _M_impl.super__Vector_impl_data + lVar11);
      local_78 = (pointer)*puVar5;
      puStack_70 = (pointer)puVar5[1];
      lVar6 = *(long *)((long)&(pvVar4->
                               super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                               )._M_impl.super__Vector_impl_data + lVar11);
      local_58 = *(ExecutionEngine **)(lVar6 + 0x10);
      uStack_50 = *(undefined8 *)(lVar6 + 0x18);
      local_48.i = local_c8.i;
      local_48.graph_id = local_c8.graph_id;
      local_48.pg = local_c8.pg;
      local_108.i = 5;
      local_108.graph_id = 0;
      local_108.pg = (ComputationGraph *)local_88;
    }
    else {
      local_88 = *(undefined1 (*) [16])
                  (*(long *)((long)&(pvVar4->
                                    super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                    )._M_impl.super__Vector_impl_data + lVar11) + 0x20);
      puVar5 = *(undefined8 **)
                ((long)&(pvVar4->
                        super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
                        _M_impl.super__Vector_impl_data + lVar11);
      local_78 = (pointer)*puVar5;
      puStack_70 = (pointer)puVar5[1];
      local_108.i = 3;
      local_108.graph_id = 0;
      local_108.pg = (ComputationGraph *)local_88;
    }
    puStack_60 = (pointer)local_138._8_8_;
    local_68 = (ComputationGraph *)local_138._0_8_;
    local_128 = detail::f<dynet::AffineTransform,std::initializer_list<dynet::Expression>>
                          ((initializer_list<dynet::Expression> *)&local_108);
    local_128 = logistic(&local_128);
    local_108 = operator-(1.0,&local_128);
    local_f8 = (Expression)ZEXT816(0);
    if (cVar10 == '\0') {
      lVar6 = *(long *)((long)&(pvVar4->
                               super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                               )._M_impl.super__Vector_impl_data + lVar11);
      local_88._0_8_ = *(undefined8 *)(lVar6 + 0x50);
      local_88._8_8_ = *(undefined8 *)(lVar6 + 0x58);
      lVar6 = *(long *)((long)&(pvVar4->
                               super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                               )._M_impl.super__Vector_impl_data + lVar11);
      local_78 = *(pointer *)(lVar6 + 0x30);
      puStack_70 = *(pointer *)(lVar6 + 0x38);
      lVar6 = *(long *)((long)&(pvVar4->
                               super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                               )._M_impl.super__Vector_impl_data + lVar11);
      local_58 = *(ExecutionEngine **)(lVar6 + 0x40);
      uStack_50 = *(undefined8 *)(lVar6 + 0x48);
      local_48.i = local_c8.i;
      local_48.graph_id = local_c8.graph_id;
      local_48.pg = local_c8.pg;
      local_148.i = 5;
      local_148.graph_id = 0;
    }
    else {
      lVar6 = *(long *)((long)&(pvVar4->
                               super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                               )._M_impl.super__Vector_impl_data + lVar11);
      local_88._0_8_ = *(undefined8 *)(lVar6 + 0x50);
      local_88._8_8_ = *(undefined8 *)(lVar6 + 0x58);
      lVar6 = *(long *)((long)&(pvVar4->
                               super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                               )._M_impl.super__Vector_impl_data + lVar11);
      local_78 = *(pointer *)(lVar6 + 0x30);
      puStack_70 = *(pointer *)(lVar6 + 0x38);
      local_148.i = 3;
      local_148.graph_id = 0;
    }
    local_148.pg = (ComputationGraph *)local_88;
    puStack_60 = (pointer)local_138._8_8_;
    local_68 = (ComputationGraph *)local_138._0_8_;
    local_f8 = detail::f<dynet::AffineTransform,std::initializer_list<dynet::Expression>>
                         ((initializer_list<dynet::Expression> *)&local_148);
    local_f8 = logistic(&local_f8);
    local_148 = (Expression)ZEXT816(0);
    if ((char)local_110 == '\0') {
      local_48 = cmult(&local_f8,&local_c8);
      local_88 = *(undefined1 (*) [16])
                  (*(long *)((long)&(pvVar4->
                                    super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                    )._M_impl.super__Vector_impl_data + lVar11) + 0x80);
      lVar6 = *(long *)((long)&(pvVar4->
                               super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                               )._M_impl.super__Vector_impl_data + lVar11);
      local_78 = *(pointer *)(lVar6 + 0x60);
      puStack_70 = *(pointer *)(lVar6 + 0x68);
      local_68 = (ComputationGraph *)local_138._0_8_;
      puStack_60 = (pointer)local_138._8_8_;
      lVar6 = *(long *)((long)&(pvVar4->
                               super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                               )._M_impl.super__Vector_impl_data + lVar11);
      local_58 = *(ExecutionEngine **)(lVar6 + 0x70);
      uStack_50 = *(undefined8 *)(lVar6 + 0x78);
      local_e0.i = 5;
      local_e0.graph_id = 0;
      local_e0.pg = (ComputationGraph *)local_88;
      local_148 = detail::f<dynet::AffineTransform,std::initializer_list<dynet::Expression>>
                            ((initializer_list<dynet::Expression> *)&local_e0);
      tanh((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      local_88 = (undefined1  [16])cmult(&local_128,&local_148);
      local_e0 = cmult(&local_108,&local_c8);
      EVar12 = operator+(&local_e0,(Expression *)local_88);
    }
    else {
      local_88 = *(undefined1 (*) [16])
                  (*(long *)((long)&(pvVar4->
                                    super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                    )._M_impl.super__Vector_impl_data + lVar11) + 0x80);
      lVar6 = *(long *)((long)&(pvVar4->
                               super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                               )._M_impl.super__Vector_impl_data + lVar11);
      local_78 = *(pointer *)(lVar6 + 0x60);
      puStack_70 = *(pointer *)(lVar6 + 0x68);
      local_68 = (ComputationGraph *)local_138._0_8_;
      puStack_60 = (pointer)local_138._8_8_;
      local_e0.i = 3;
      local_e0.graph_id = 0;
      local_e0.pg = (ComputationGraph *)local_88;
      local_148 = detail::f<dynet::AffineTransform,std::initializer_list<dynet::Expression>>
                            ((initializer_list<dynet::Expression> *)&local_e0);
      tanh((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      EVar12 = cmult(&local_128,&local_148);
    }
    pEVar2 = local_e8[-1].super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
             _M_impl.super__Vector_impl_data._M_start;
    *(ComputationGraph **)((long)&pEVar2->pg + lVar9) = EVar12.pg;
    *(long *)((long)&pEVar2->i + lVar9) = EVar12._8_8_;
    local_138 = *(undefined1 (*) [16])((long)&pEVar2->pg + lVar9);
    lVar11 = lVar11 + 0x18;
    lVar9 = lVar9 + 0x10;
    cVar10 = (char)local_110;
    uVar8 = local_90 + 1;
  }
  fVar1 = (local_98->super_RNNBuilder).dropout_rate;
  pEVar2 = local_e8[-1].super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    EVar12 = dropout(pEVar2 + -1,fVar1);
  }
  else {
    EVar12 = pEVar2[-1];
  }
  return EVar12;
}

Assistant:

Expression GRUBuilder::add_input_impl(int prev, const Expression& x) {
  //if(dropout_rate != 0.f)
  //throw std::runtime_error("GRUBuilder doesn't support dropout yet");
  const bool has_initial_state = (h0.size() > 0);
  h.push_back(vector<Expression>(layers));
  vector<Expression>& ht = h.back();
  Expression in = x;
  for (unsigned i = 0; i < layers; ++i) {
    const vector<Expression>& vars = param_vars[i];
    Expression h_tprev;
    // prev_zero means that h_tprev should be treated as 0
    bool prev_zero = false;
    if (prev >= 0 || has_initial_state) {
      h_tprev = (prev < 0) ? h0[i] : h[prev][i];
    } else { prev_zero = true; }
    if (dropout_rate) in = dropout(in, dropout_rate);
    // update gate
    Expression zt;
    if (prev_zero)
      zt = affine_transform({vars[BZ], vars[X2Z], in});
    else
      zt = affine_transform({vars[BZ], vars[X2Z], in, vars[H2Z], h_tprev});
    zt = logistic(zt);
    // forget
    Expression ft = 1.f - zt;
    // reset gate
    Expression rt;
    if (prev_zero)
      rt = affine_transform({vars[BR], vars[X2R], in});
    else
      rt = affine_transform({vars[BR], vars[X2R], in, vars[H2R], h_tprev});
    rt = logistic(rt);

    // candidate activation
    Expression ct;
    if (prev_zero) {
      ct = affine_transform({vars[BH], vars[X2H], in});
      ct = tanh(ct);
      Expression nwt = cmult(zt, ct);
      in = ht[i] = nwt;
    } else {
      Expression ght = cmult(rt, h_tprev);
      ct = affine_transform({vars[BH], vars[X2H], in, vars[H2H], ght});
      ct = tanh(ct);
      Expression nwt = cmult(zt, ct);
      Expression crt = cmult(ft, h_tprev);
      in = ht[i] = crt + nwt;
    }
  }
  if (dropout_rate) return dropout(ht.back(), dropout_rate);
  else return ht.back();
}